

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Networking.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Networking_Inline(X3DImporter *this)

{
  FIReader *pFVar1;
  IOSystem *pIVar2;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  ulong uVar7;
  uint pAttrIdx;
  string *psVar8;
  bool local_c9;
  string an;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  url;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string use;
  string def;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  pAttrIdx = 0;
  url.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&url;
  url.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def.field_2._M_local_buf[0] = '\0';
  use.field_2._M_local_buf[0] = '\0';
  url.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       url.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  uVar4 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  local_c9 = true;
  do {
    if (uVar4 == pAttrIdx) {
      if (use._M_string_length == 0) {
        ParseHelper_Group_Begin(this,true);
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
        }
        if ((local_c9 &
            url.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&url) == 1) {
          iVar5 = (*this->mpIOHandler->_vptr_IOSystem[8])();
          std::operator+(&an,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar5),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (url.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next + 1));
          while( true ) {
            do {
              lVar6 = std::__cxx11::string::find((string *)&an,0x82f120);
            } while (lVar6 == 0);
            if (lVar6 == -1) break;
            uVar7 = std::__cxx11::string::rfind((char)&an,0x2f);
            if (uVar7 == 0xffffffffffffffff) {
              std::__cxx11::string::erase((ulong)&an,0);
            }
            else {
              std::__cxx11::string::erase((ulong)&an,uVar7);
            }
          }
          lVar6 = std::__cxx11::string::find_last_of((char *)&an,0x5a5b7b);
          pIVar2 = this->mpIOHandler;
          if (lVar6 == -1) {
            local_90 = local_80;
            local_88 = 0;
            local_80[0] = 0;
          }
          else {
            std::__cxx11::string::substr((ulong)&local_90,(ulong)&an);
          }
          (*pIVar2->_vptr_IOSystem[7])(pIVar2,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          ParseFile(this,&an,this->mpIOHandler);
          (*this->mpIOHandler->_vptr_IOSystem[10])();
          std::__cxx11::string::~string((string *)&an);
        }
        iVar5 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        if ((char)iVar5 == '\0') {
          pParentElement = this->NodeElement_Cur;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&an,"Inline",(allocator<char> *)&local_90);
          ParseNode_Metadata(this,pParentElement,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        ParseHelper_Node_Exit(this);
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar3 = FindNodeElement(this,&use,ENET_Group,(CX3DImporter_NodeElement **)&an);
        if (!bVar3) {
          Throw_USE_NotFound(this,&use);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,(value_type *)&an);
      }
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&url.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      std::__cxx11::string::~string((string *)&use);
      std::__cxx11::string::~string((string *)&def);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar5 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar5),(allocator<char> *)&local_90);
    bVar3 = std::operator==(&an,"DEF");
    if (bVar3) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar8 = &def;
LAB_004e1625:
      std::__cxx11::string::assign((char *)psVar8);
    }
    else {
      bVar3 = std::operator==(&an,"USE");
      if (bVar3) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar8 = &use;
        goto LAB_004e1625;
      }
      bVar3 = std::operator==(&an,"bboxCenter");
      if (!bVar3) {
        bVar3 = std::operator==(&an,"bboxSize");
        if (!bVar3) {
          bVar3 = std::operator==(&an,"containerField");
          if (!bVar3) {
            bVar3 = std::operator==(&an,"load");
            if (bVar3) {
              local_c9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              bVar3 = std::operator==(&an,"url");
              if (bVar3) {
                XML_ReadNode_GetAttrVal_AsListS(this,pAttrIdx,&url);
              }
              else {
                Throw_IncorrectAttr(this,&an);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Networking_Inline()
{
    std::string def, use;
    bool load = true;
    std::list<std::string> url;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("load", load, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("url", url, XML_ReadNode_GetAttrVal_AsListS);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne;

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin(true);// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
		if(!def.empty()) NodeElement_Cur->ID = def;

		if(load && !url.empty())
		{
			std::string full_path = mpIOHandler->CurrentDirectory() + url.front();

			//full_path = std::regex_replace(full_path, pattern_parentDir, "$1");
			for (std::string::size_type pos = full_path.find(parentDir); pos != std::string::npos; pos = full_path.find(parentDir, pos)) {
				if (pos > 0) {
					std::string::size_type pos2 = full_path.rfind('/', pos - 1);
					if (pos2 != std::string::npos) {
						full_path.erase(pos2, pos - pos2 + 3);
						pos = pos2;
					}
					else {
						full_path.erase(0, pos + 4);
						pos = 0;
					}
				}
				else {
					pos += 3;
				}
			}
			// Attribute "url" can contain list of strings. But we need only one - first.
			std::string::size_type slashPos = full_path.find_last_of("\\/");
			mpIOHandler->PushDirectory(slashPos == std::string::npos ? std::string() : full_path.substr(0, slashPos + 1));
			ParseFile(full_path, mpIOHandler);
			mpIOHandler->PopDirectory();
		}

		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement()) ParseNode_Metadata(NodeElement_Cur, "Inline");

		// exit from node in that place
		ParseHelper_Node_Exit();
	}// if(!use.empty()) else
}